

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

bool Fl::option(Fl_Option opt)

{
  undefined1 local_88 [8];
  Fl_Preferences opt_prefs_1;
  Fl_Preferences prefs_1;
  undefined1 local_48 [8];
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  int tmp;
  Fl_Option opt_local;
  
  if (options_read_ == '\0') {
    Fl_Preferences::Fl_Preferences((Fl_Preferences *)&opt_prefs.rootNode,SYSTEM,"fltk.org","fltk");
    Fl_Preferences::Fl_Preferences
              ((Fl_Preferences *)local_48,(Fl_Preferences *)&opt_prefs.rootNode,"options");
    Fl_Preferences::get((Fl_Preferences *)local_48,"ArrowFocus",(int *)((long)&prefs.rootNode + 4),0
                       );
    options_[0] = prefs.rootNode._4_1_;
    Fl_Preferences::get((Fl_Preferences *)local_48,"VisibleFocus",(int *)((long)&prefs.rootNode + 4)
                        ,1);
    options_[1] = prefs.rootNode._4_1_;
    Fl_Preferences::get((Fl_Preferences *)local_48,"DNDText",(int *)((long)&prefs.rootNode + 4),1);
    options_[2] = prefs.rootNode._4_1_;
    Fl_Preferences::get((Fl_Preferences *)local_48,"ShowTooltips",(int *)((long)&prefs.rootNode + 4)
                        ,1);
    options_[3] = prefs.rootNode._4_1_;
    Fl_Preferences::get((Fl_Preferences *)local_48,"FNFCUsesGTK",(int *)((long)&prefs.rootNode + 4),
                        1);
    options_[4] = prefs.rootNode._4_1_;
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_48);
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)&opt_prefs.rootNode);
    Fl_Preferences::Fl_Preferences((Fl_Preferences *)&opt_prefs_1.rootNode,USER,"fltk.org","fltk");
    Fl_Preferences::Fl_Preferences
              ((Fl_Preferences *)local_88,(Fl_Preferences *)&opt_prefs_1.rootNode,"options");
    Fl_Preferences::get((Fl_Preferences *)local_88,"ArrowFocus",(int *)((long)&prefs.rootNode + 4),
                        -1);
    if (-1 < prefs.rootNode._4_4_) {
      options_[0] = (uchar)prefs.rootNode._4_4_;
    }
    Fl_Preferences::get((Fl_Preferences *)local_88,"VisibleFocus",(int *)((long)&prefs.rootNode + 4)
                        ,-1);
    if (-1 < prefs.rootNode._4_4_) {
      options_[1] = (uchar)prefs.rootNode._4_4_;
    }
    Fl_Preferences::get((Fl_Preferences *)local_88,"DNDText",(int *)((long)&prefs.rootNode + 4),-1);
    if (-1 < prefs.rootNode._4_4_) {
      options_[2] = (uchar)prefs.rootNode._4_4_;
    }
    Fl_Preferences::get((Fl_Preferences *)local_88,"ShowTooltips",(int *)((long)&prefs.rootNode + 4)
                        ,-1);
    if (-1 < prefs.rootNode._4_4_) {
      options_[3] = (uchar)prefs.rootNode._4_4_;
    }
    Fl_Preferences::get((Fl_Preferences *)local_88,"FNFCUsesGTK",(int *)((long)&prefs.rootNode + 4),
                        -1);
    if (-1 < prefs.rootNode._4_4_) {
      options_[4] = (uchar)prefs.rootNode._4_4_;
    }
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_88);
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)&opt_prefs_1.rootNode);
    options_read_ = '\x01';
  }
  if (((int)opt < 0) || (4 < (int)opt)) {
    tmp._3_1_ = false;
  }
  else {
    tmp._3_1_ = options_[opt] != '\0';
  }
  return tmp._3_1_;
}

Assistant:

bool Fl::option(Fl_Option opt)
{
  if (!options_read_) {
    int tmp;
    { // first, read the system wide preferences
      Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
      Fl_Preferences opt_prefs(prefs, "options");
      opt_prefs.get("ArrowFocus", tmp, 0);                      // default: off
      options_[OPTION_ARROW_FOCUS] = tmp;
      //opt_prefs.get("NativeFilechooser", tmp, 1);             // default: on
      //options_[OPTION_NATIVE_FILECHOOSER] = tmp;
      //opt_prefs.get("FilechooserPreview", tmp, 1);            // default: on
      //options_[OPTION_FILECHOOSER_PREVIEW] = tmp;
      opt_prefs.get("VisibleFocus", tmp, 1);                    // default: on
      options_[OPTION_VISIBLE_FOCUS] = tmp;
      opt_prefs.get("DNDText", tmp, 1);                         // default: on
      options_[OPTION_DND_TEXT] = tmp;
      opt_prefs.get("ShowTooltips", tmp, 1);                    // default: on
      options_[OPTION_SHOW_TOOLTIPS] = tmp;
      opt_prefs.get("FNFCUsesGTK", tmp, 1);                    // default: on
      options_[OPTION_FNFC_USES_GTK] = tmp;
    }
    { // next, check the user preferences
      // override system options only, if the option is set ( >= 0 )
      Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
      Fl_Preferences opt_prefs(prefs, "options");
      opt_prefs.get("ArrowFocus", tmp, -1);
      if (tmp >= 0) options_[OPTION_ARROW_FOCUS] = tmp;
      //opt_prefs.get("NativeFilechooser", tmp, -1);
      //if (tmp >= 0) options_[OPTION_NATIVE_FILECHOOSER] = tmp;
      //opt_prefs.get("FilechooserPreview", tmp, -1);
      //if (tmp >= 0) options_[OPTION_FILECHOOSER_PREVIEW] = tmp;
      opt_prefs.get("VisibleFocus", tmp, -1);
      if (tmp >= 0) options_[OPTION_VISIBLE_FOCUS] = tmp;
      opt_prefs.get("DNDText", tmp, -1);
      if (tmp >= 0) options_[OPTION_DND_TEXT] = tmp;
      opt_prefs.get("ShowTooltips", tmp, -1);
      if (tmp >= 0) options_[OPTION_SHOW_TOOLTIPS] = tmp;
      opt_prefs.get("FNFCUsesGTK", tmp, -1);
      if (tmp >= 0) options_[OPTION_FNFC_USES_GTK] = tmp;
    }
    { // now, if the developer has registered this app, we could as for per-application preferences
    }
    options_read_ = 1;
  }
  if (opt<0 || opt>=OPTION_LAST)
    return false;
  return (bool)(options_[opt]!=0);
}